

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructDef *pSVar2;
  FieldDef *pFVar3;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  _Var4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  long *plVar8;
  ulong *puVar9;
  undefined8 uVar10;
  long *local_d0;
  long local_c0;
  undefined8 uStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  pSVar2 = (field->value).type.struct_def;
  if (pSVar2->has_key == false) {
    __assert_fail("vectortype.struct_def->has_key",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x224,
                  "void flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(flatbuffers::StructDef_const&,flatbuffers::FieldDef_const&,std::__cxx11::string*)::_lambda(flatbuffers::FieldDef*)_1_>>
                    ((pSVar2->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pSVar2->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pFVar3 = *_Var4._M_current;
  if (pFVar3->key == false) {
    __assert_fail("key_field.key",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x22e,
                  "void flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_90,&this->namer_,field);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x376aab);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar6;
  }
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  TypeName_abi_cxx11_(&local_b0,this,field);
  puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x37539c);
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar6;
  }
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  NativeType_abi_cxx11_(&local_50,this,&(pFVar3->value).type);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3755b8);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  paVar1 = &local_b0.field_2;
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_b0.field_2._M_allocated_capacity = *puVar9;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar9;
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  OffsetPrefix_abi_cxx11_(&local_70,this,field);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    uVar10 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_70._M_string_length + local_b0._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar10 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_b0._M_string_length <= (ulong)uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      goto LAB_002140ff;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
LAB_002140ff:
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar6;
  }
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenEnumType(const EnumDef &enum_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "type " + GetEnumTypeName(enum_def) + " ";
    code += GenTypeBasic(enum_def.underlying_type) + "\n\n";
  }